

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::ShaderMatrixTests::init(ShaderMatrixTests *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  MatrixOp op;
  DataType dataType;
  Precision precision;
  char *__s;
  Context *pCVar3;
  int vecSize;
  DataType dataType_00;
  TestNode *node;
  long *plVar4;
  ShaderMatrixCase *pSVar5;
  ulong uVar6;
  long *plVar7;
  size_type *psVar8;
  long lVar9;
  ShaderInput scalarIn;
  undefined4 uStack_1cc;
  long local_1c8;
  long lStack_1c0;
  string vecMatName;
  ShaderInput matIn;
  allocator<char> local_159;
  string baseName;
  ShaderInput otherMatIn_1;
  undefined4 uStack_12c;
  long local_128;
  long lStack_120;
  DataType local_118;
  InputType local_114;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  char *local_f0;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  ShaderInput vecIn;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  uint local_98;
  uint local_94;
  InputType local_90;
  InputType local_8c;
  char *local_88;
  long local_80;
  InputTypeSpec *local_78;
  ulong local_70;
  long local_68;
  InputTypeSpec *local_60;
  long local_58;
  long *local_50 [2];
  long local_40 [2];
  
  paVar1 = &vecMatName.field_2;
  lVar9 = 0;
  do {
    local_78 = init::reducedInputTypes;
    bVar2 = init::ops[lVar9].extendedInputTypeCases;
    if (bVar2 != false) {
      local_78 = init::extendedInputTypes;
    }
    op = init::ops[lVar9].op;
    local_80 = lVar9;
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::ops[lVar9].name,init::ops[lVar9].desc);
    tcu::TestNode::addChild((TestNode *)this,node);
    local_94 = op - OP_UNARY_PLUS;
    local_98 = op - OP_ADD_INTO;
    local_90 = (op != OP_DIV) + INPUTTYPE_UNIFORM;
    uVar6 = 0;
    do {
      local_60 = local_78 + uVar6;
      local_8c = local_60->type;
      local_114 = local_8c;
      if (local_8c == INPUTTYPE_DYNAMIC) {
        local_114 = INPUTTYPE_UNIFORM;
      }
      lVar9 = 0;
      local_70 = uVar6;
      do {
        dataType = init::matrixTypes[lVar9];
        local_68 = lVar9;
        local_f0 = glu::getDataTypeName(dataType);
        lVar9 = 0;
        do {
          precision = *(Precision *)((long)init::precisions + lVar9);
          local_58 = lVar9;
          local_88 = glu::getPrecisionName(precision);
          __s = local_60->name;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e8,__s,(allocator<char> *)&local_b8);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_e8);
          plVar7 = plVar4 + 2;
          if ((long *)*plVar4 == plVar7) {
            local_100 = *plVar7;
            lStack_f8 = plVar4[3];
            local_110 = &local_100;
          }
          else {
            local_100 = *plVar7;
            local_110 = (long *)*plVar4;
          }
          local_108 = plVar4[1];
          *plVar4 = (long)plVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_110);
          plVar7 = plVar4 + 2;
          if ((long *)*plVar4 == plVar7) {
            local_128 = *plVar7;
            lStack_120 = plVar4[3];
            otherMatIn_1._0_8_ = &local_128;
          }
          else {
            local_128 = *plVar7;
            otherMatIn_1._0_8_ = (long *)*plVar4;
          }
          unique0x00012000 = plVar4[1];
          *plVar4 = (long)plVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&otherMatIn_1);
          scalarIn._0_8_ = &local_1c8;
          plVar7 = plVar4 + 2;
          if ((long *)*plVar4 == plVar7) {
            local_1c8 = *plVar7;
            lStack_1c0 = plVar4[3];
          }
          else {
            local_1c8 = *plVar7;
            scalarIn._0_8_ = (long *)*plVar4;
          }
          unique0x00012000 = plVar4[1];
          *plVar4 = (long)plVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&scalarIn);
          psVar8 = (size_type *)(plVar4 + 2);
          if ((size_type *)*plVar4 == psVar8) {
            vecMatName.field_2._M_allocated_capacity = *psVar8;
            vecMatName.field_2._8_8_ = plVar4[3];
            vecMatName._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            vecMatName.field_2._M_allocated_capacity = *psVar8;
            vecMatName._M_dataplus._M_p = (pointer)*plVar4;
          }
          vecMatName._M_string_length = plVar4[1];
          *plVar4 = (long)psVar8;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&vecMatName);
          baseName._M_dataplus._M_p = (pointer)&baseName.field_2;
          psVar8 = (size_type *)(plVar4 + 2);
          if ((size_type *)*plVar4 == psVar8) {
            baseName.field_2._M_allocated_capacity = *psVar8;
            baseName.field_2._8_8_ = plVar4[3];
          }
          else {
            baseName.field_2._M_allocated_capacity = *psVar8;
            baseName._M_dataplus._M_p = (pointer)*plVar4;
          }
          baseName._M_string_length = plVar4[1];
          *plVar4 = (long)psVar8;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)vecMatName._M_dataplus._M_p != paVar1) {
            operator_delete(vecMatName._M_dataplus._M_p,vecMatName.field_2._M_allocated_capacity + 1
                           );
          }
          if ((long *)scalarIn._0_8_ != &local_1c8) {
            operator_delete((void *)scalarIn._0_8_,local_1c8 + 1);
          }
          if ((long *)otherMatIn_1._0_8_ != &local_128) {
            operator_delete((void *)otherMatIn_1._0_8_,local_128 + 1);
          }
          if (local_110 != &local_100) {
            operator_delete(local_110,local_100 + 1);
          }
          if (local_e8 != &local_d8) {
            operator_delete(local_e8,local_d8 + 1);
          }
          matIn.inputType = local_8c;
          matIn.dataType = dataType;
          matIn.precision = precision;
          if (op < OP_COMP_MUL) {
            scalarIn.dataType = TYPE_FLOAT;
            scalarIn.inputType = local_90;
            stack0xfffffffffffffe30 = CONCAT44(uStack_1cc,precision);
            pSVar5 = (ShaderMatrixCase *)operator_new(0x148);
            pCVar3 = (this->super_TestCaseGroup).m_context;
            vecMatName._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&vecMatName,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&vecMatName);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar5,pCVar3,vecMatName._M_dataplus._M_p,"Matrix-scalar case",&matIn,
                       &scalarIn,op,true);
            tcu::TestNode::addChild(node,(TestNode *)pSVar5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != paVar1) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            pSVar5 = (ShaderMatrixCase *)operator_new(0x148);
            pCVar3 = (this->super_TestCaseGroup).m_context;
            vecMatName._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&vecMatName,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&vecMatName);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar5,pCVar3,vecMatName._M_dataplus._M_p,"Matrix-scalar case",&matIn,
                       &scalarIn,op,false);
            tcu::TestNode::addChild(node,(TestNode *)pSVar5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != paVar1) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            if (op == OP_MUL) {
              vecSize = glu::getDataTypeMatrixNumColumns(dataType);
              dataType_00 = glu::getDataTypeFloatVec(vecSize);
              vecIn.inputType = INPUTTYPE_DYNAMIC;
              vecIn.dataType = dataType_00;
              vecIn.precision = precision;
              pSVar5 = (ShaderMatrixCase *)operator_new(0x148);
              pCVar3 = (this->super_TestCaseGroup).m_context;
              local_118 = dataType_00;
              glu::getDataTypeName(dataType_00);
              scalarIn._0_8_ = &local_1c8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&scalarIn,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&scalarIn);
              plVar4 = (long *)std::__cxx11::string::append((char *)&scalarIn);
              psVar8 = (size_type *)(plVar4 + 2);
              if ((size_type *)*plVar4 == psVar8) {
                vecMatName.field_2._M_allocated_capacity = *psVar8;
                vecMatName.field_2._8_8_ = plVar4[3];
                vecMatName._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                vecMatName.field_2._M_allocated_capacity = *psVar8;
                vecMatName._M_dataplus._M_p = (pointer)*plVar4;
              }
              vecMatName._M_string_length = plVar4[1];
              *plVar4 = (long)psVar8;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar5,pCVar3,vecMatName._M_dataplus._M_p,"Matrix-vector case",&matIn,
                         &vecIn,OP_MUL,true);
              tcu::TestNode::addChild(node,(TestNode *)pSVar5);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != paVar1) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              if ((long *)scalarIn._0_8_ != &local_1c8) {
                operator_delete((void *)scalarIn._0_8_,local_1c8 + 1);
              }
              pSVar5 = (ShaderMatrixCase *)operator_new(0x148);
              pCVar3 = (this->super_TestCaseGroup).m_context;
              glu::getDataTypeName(local_118);
              scalarIn._0_8_ = &local_1c8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&scalarIn,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&scalarIn);
              plVar4 = (long *)std::__cxx11::string::append((char *)&scalarIn);
              psVar8 = (size_type *)(plVar4 + 2);
              if ((size_type *)*plVar4 == psVar8) {
                vecMatName.field_2._M_allocated_capacity = *psVar8;
                vecMatName.field_2._8_8_ = plVar4[3];
                vecMatName._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                vecMatName.field_2._M_allocated_capacity = *psVar8;
                vecMatName._M_dataplus._M_p = (pointer)*plVar4;
              }
              vecMatName._M_string_length = plVar4[1];
              *plVar4 = (long)psVar8;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar5,pCVar3,vecMatName._M_dataplus._M_p,"Matrix-vector case",&matIn,
                         &vecIn,OP_MUL,false);
              tcu::TestNode::addChild(node,(TestNode *)pSVar5);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != paVar1) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              if ((long *)scalarIn._0_8_ != &local_1c8) {
                operator_delete((void *)scalarIn._0_8_,local_1c8 + 1);
              }
              std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_159);
              plVar4 = (long *)std::__cxx11::string::append((char *)local_50);
              local_b8 = &local_a8;
              plVar7 = plVar4 + 2;
              if ((long *)*plVar4 == plVar7) {
                local_a8 = *plVar7;
                lStack_a0 = plVar4[3];
              }
              else {
                local_a8 = *plVar7;
                local_b8 = (long *)*plVar4;
              }
              local_b0 = plVar4[1];
              *plVar4 = (long)plVar7;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_b8);
              local_e8 = &local_d8;
              plVar7 = plVar4 + 2;
              if ((long *)*plVar4 == plVar7) {
                local_d8 = *plVar7;
                lStack_d0 = plVar4[3];
              }
              else {
                local_d8 = *plVar7;
                local_e8 = (long *)*plVar4;
              }
              local_e0 = plVar4[1];
              *plVar4 = (long)plVar7;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_e8);
              plVar7 = plVar4 + 2;
              if ((long *)*plVar4 == plVar7) {
                local_100 = *plVar7;
                lStack_f8 = plVar4[3];
                local_110 = &local_100;
              }
              else {
                local_100 = *plVar7;
                local_110 = (long *)*plVar4;
              }
              local_108 = plVar4[1];
              *plVar4 = (long)plVar7;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              glu::getDataTypeName(local_118);
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_110);
              plVar7 = plVar4 + 2;
              if ((long *)*plVar4 == plVar7) {
                local_128 = *plVar7;
                lStack_120 = plVar4[3];
                otherMatIn_1._0_8_ = &local_128;
              }
              else {
                local_128 = *plVar7;
                otherMatIn_1._0_8_ = (long *)*plVar4;
              }
              unique0x00012000 = plVar4[1];
              *plVar4 = (long)plVar7;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&otherMatIn_1);
              scalarIn._0_8_ = &local_1c8;
              plVar7 = plVar4 + 2;
              if ((long *)*plVar4 == plVar7) {
                local_1c8 = *plVar7;
                lStack_1c0 = plVar4[3];
              }
              else {
                local_1c8 = *plVar7;
                scalarIn._0_8_ = (long *)*plVar4;
              }
              unique0x00012000 = plVar4[1];
              *plVar4 = (long)plVar7;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&scalarIn);
              psVar8 = (size_type *)(plVar4 + 2);
              if ((size_type *)*plVar4 == psVar8) {
                vecMatName.field_2._M_allocated_capacity = *psVar8;
                vecMatName.field_2._8_8_ = plVar4[3];
                vecMatName._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                vecMatName.field_2._M_allocated_capacity = *psVar8;
                vecMatName._M_dataplus._M_p = (pointer)*plVar4;
              }
              vecMatName._M_string_length = plVar4[1];
              *plVar4 = (long)psVar8;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              if ((long *)scalarIn._0_8_ != &local_1c8) {
                operator_delete((void *)scalarIn._0_8_,local_1c8 + 1);
              }
              if ((long *)otherMatIn_1._0_8_ != &local_128) {
                operator_delete((void *)otherMatIn_1._0_8_,local_128 + 1);
              }
              if (local_110 != &local_100) {
                operator_delete(local_110,local_100 + 1);
              }
              if (local_e8 != &local_d8) {
                operator_delete(local_e8,local_d8 + 1);
              }
              if (local_b8 != &local_a8) {
                operator_delete(local_b8,local_a8 + 1);
              }
              if (local_50[0] != local_40) {
                operator_delete(local_50[0],local_40[0] + 1);
              }
              pSVar5 = (ShaderMatrixCase *)operator_new(0x148);
              pCVar3 = (this->super_TestCaseGroup).m_context;
              scalarIn._0_8_ = &local_1c8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&scalarIn,vecMatName._M_dataplus._M_p,
                         vecMatName._M_dataplus._M_p + vecMatName._M_string_length);
              std::__cxx11::string::append((char *)&scalarIn);
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar5,pCVar3,(char *)scalarIn._0_8_,"Vector-matrix case",&vecIn,&matIn,
                         OP_MUL,true);
              tcu::TestNode::addChild(node,(TestNode *)pSVar5);
              if ((long *)scalarIn._0_8_ != &local_1c8) {
                operator_delete((void *)scalarIn._0_8_,local_1c8 + 1);
              }
              pSVar5 = (ShaderMatrixCase *)operator_new(0x148);
              pCVar3 = (this->super_TestCaseGroup).m_context;
              scalarIn._0_8_ = &local_1c8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&scalarIn,vecMatName._M_dataplus._M_p,
                         vecMatName._M_dataplus._M_p + vecMatName._M_string_length);
              std::__cxx11::string::append((char *)&scalarIn);
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar5,pCVar3,(char *)scalarIn._0_8_,"Vector-matrix case",&vecIn,&matIn,
                         OP_MUL,false);
              tcu::TestNode::addChild(node,(TestNode *)pSVar5);
              if ((long *)scalarIn._0_8_ != &local_1c8) {
                operator_delete((void *)scalarIn._0_8_,local_1c8 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != paVar1) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
            }
LAB_00efa2e2:
            otherMatIn_1.dataType = dataType;
            otherMatIn_1.inputType = local_114;
            stack0xfffffffffffffed0 = CONCAT44(uStack_12c,precision);
            pSVar5 = (ShaderMatrixCase *)operator_new(0x148);
            pCVar3 = (this->super_TestCaseGroup).m_context;
            scalarIn._0_8_ = &local_1c8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&scalarIn,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&scalarIn);
            plVar4 = (long *)std::__cxx11::string::append((char *)&scalarIn);
            psVar8 = (size_type *)(plVar4 + 2);
            if ((size_type *)*plVar4 == psVar8) {
              vecMatName.field_2._M_allocated_capacity = *psVar8;
              vecMatName.field_2._8_8_ = plVar4[3];
              vecMatName._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              vecMatName.field_2._M_allocated_capacity = *psVar8;
              vecMatName._M_dataplus._M_p = (pointer)*plVar4;
            }
            vecMatName._M_string_length = plVar4[1];
            *plVar4 = (long)psVar8;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar5,pCVar3,vecMatName._M_dataplus._M_p,"Matrix-matrix case",&matIn,
                       &otherMatIn_1,op,true);
            tcu::TestNode::addChild(node,(TestNode *)pSVar5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != paVar1) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            if ((long *)scalarIn._0_8_ != &local_1c8) {
              operator_delete((void *)scalarIn._0_8_,local_1c8 + 1);
            }
            pSVar5 = (ShaderMatrixCase *)operator_new(0x148);
            pCVar3 = (this->super_TestCaseGroup).m_context;
            scalarIn._0_8_ = &local_1c8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&scalarIn,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&scalarIn);
            plVar4 = (long *)std::__cxx11::string::append((char *)&scalarIn);
            psVar8 = (size_type *)(plVar4 + 2);
            if ((size_type *)*plVar4 == psVar8) {
              vecMatName.field_2._M_allocated_capacity = *psVar8;
              vecMatName.field_2._8_8_ = plVar4[3];
              vecMatName._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              vecMatName.field_2._M_allocated_capacity = *psVar8;
              vecMatName._M_dataplus._M_p = (pointer)*plVar4;
            }
            vecMatName._M_string_length = plVar4[1];
            *plVar4 = (long)psVar8;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar5,pCVar3,vecMatName._M_dataplus._M_p,"Matrix-matrix case",&matIn,
                       &otherMatIn_1,op,false);
            tcu::TestNode::addChild(node,(TestNode *)pSVar5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != paVar1) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            if ((long *)scalarIn._0_8_ != &local_1c8) {
              operator_delete((void *)scalarIn._0_8_,local_1c8 + 1);
            }
          }
          else {
            if (op == OP_COMP_MUL) goto LAB_00efa2e2;
            if (local_94 < 6) {
              scalarIn.inputType = INPUTTYPE_LAST;
              scalarIn.dataType = TYPE_LAST;
              stack0xfffffffffffffe30 = CONCAT44(uStack_1cc,3);
              pSVar5 = (ShaderMatrixCase *)operator_new(0x148);
              pCVar3 = (this->super_TestCaseGroup).m_context;
              vecMatName._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&vecMatName,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&vecMatName);
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar5,pCVar3,vecMatName._M_dataplus._M_p,"Matrix case",&matIn,&scalarIn,op
                         ,true);
              tcu::TestNode::addChild(node,(TestNode *)pSVar5);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != paVar1) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              pSVar5 = (ShaderMatrixCase *)operator_new(0x148);
              pCVar3 = (this->super_TestCaseGroup).m_context;
              vecMatName._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&vecMatName,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&vecMatName);
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar5,pCVar3,vecMatName._M_dataplus._M_p,"Matrix case",&matIn,&scalarIn,op
                         ,false);
              tcu::TestNode::addChild(node,(TestNode *)pSVar5);
LAB_00ef9c8c:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != paVar1) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
            }
            else if (local_98 < 4) {
              scalarIn.dataType = dataType;
              scalarIn.inputType = local_114;
              stack0xfffffffffffffe30 = CONCAT44(uStack_1cc,precision);
              pSVar5 = (ShaderMatrixCase *)operator_new(0x148);
              pCVar3 = (this->super_TestCaseGroup).m_context;
              vecMatName._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&vecMatName,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&vecMatName);
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar5,pCVar3,vecMatName._M_dataplus._M_p,"Matrix assignment case",&matIn,
                         &scalarIn,op,true);
              tcu::TestNode::addChild(node,(TestNode *)pSVar5);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != paVar1) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              pSVar5 = (ShaderMatrixCase *)operator_new(0x148);
              pCVar3 = (this->super_TestCaseGroup).m_context;
              vecMatName._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&vecMatName,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&vecMatName);
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar5,pCVar3,vecMatName._M_dataplus._M_p,"Matrix assignment case",&matIn,
                         &scalarIn,op,false);
              tcu::TestNode::addChild(node,(TestNode *)pSVar5);
              goto LAB_00ef9c8c;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)baseName._M_dataplus._M_p != &baseName.field_2) {
            operator_delete(baseName._M_dataplus._M_p,baseName.field_2._M_allocated_capacity + 1);
          }
          lVar9 = local_58 + 4;
        } while (lVar9 != 0xc);
        lVar9 = local_68 + 1;
      } while (lVar9 != 3);
    } while ((local_70 < 2) && (uVar6 = local_70 + 1, bVar2 != false));
    lVar9 = local_80 + 1;
    if (lVar9 == 0xf) {
      return 0xf;
    }
  } while( true );
}

Assistant:

void ShaderMatrixTests::init (void)
{
	static const struct
	{
		const char*		name;
		const char*		desc;
		MatrixOp		op;
		bool			extendedInputTypeCases; // !< test with const and uniform types too
	} ops[] =
	{
		{ "add",			"Matrix addition tests",						OP_ADD,				true	},
		{ "sub",			"Matrix subtraction tests",						OP_SUB,				true	},
		{ "mul",			"Matrix multiplication tests",					OP_MUL,				true	},
		{ "div",			"Matrix division tests",						OP_DIV,				true	},
		{ "matrixcompmult",	"Matrix component-wise multiplication tests",	OP_COMP_MUL,		false	},
		{ "unary_addition",	"Matrix unary addition tests",					OP_UNARY_PLUS,		false	},
		{ "negation",		"Matrix negation tests",						OP_NEGATION,		false	},
		{ "pre_increment",	"Matrix prefix increment tests",				OP_PRE_INCREMENT,	false	},
		{ "pre_decrement",	"Matrix prefix decrement tests",				OP_PRE_DECREMENT,	false	},
		{ "post_increment",	"Matrix postfix increment tests",				OP_POST_INCREMENT,	false	},
		{ "post_decrement",	"Matrix postfix decrement tests",				OP_POST_DECREMENT,	false	},
		{ "add_assign",		"Matrix add into tests",						OP_ADD_INTO,		false	},
		{ "sub_assign",		"Matrix subtract from tests",					OP_SUBTRACT_FROM,	false	},
		{ "mul_assign",		"Matrix multiply into tests",					OP_MULTIPLY_INTO,	false	},
		{ "div_assign",		"Matrix divide into tests",						OP_DIVIDE_INTO,		false	},
	};

	struct InputTypeSpec
	{
		const char*		name;
		const char*		desc;
		InputType		type;
	};
	static const InputTypeSpec extendedInputTypes[] =
	{
		{ "const",		"Constant matrix input",	INPUTTYPE_CONST		},
		{ "uniform",	"Uniform matrix input",		INPUTTYPE_UNIFORM	},
		{ "dynamic",	"Dynamic matrix input",		INPUTTYPE_DYNAMIC	}
	};
	static const InputTypeSpec reducedInputTypes[] =
	{
		{ "dynamic",	"Dynamic matrix input",		INPUTTYPE_DYNAMIC	}
	};

	static const DataType matrixTypes[] =
	{
		TYPE_FLOAT_MAT2,
		TYPE_FLOAT_MAT3,
		TYPE_FLOAT_MAT4
	};

	static const Precision precisions[] =
	{
		PRECISION_LOWP,
		PRECISION_MEDIUMP,
		PRECISION_HIGHP
	};

	for (int opNdx = 0; opNdx < DE_LENGTH_OF_ARRAY(ops); opNdx++)
	{
		const InputTypeSpec*	inTypeList		= (ops[opNdx].extendedInputTypeCases) ? (extendedInputTypes) : (reducedInputTypes);
		const int				inTypeListSize	= (ops[opNdx].extendedInputTypeCases) ? (DE_LENGTH_OF_ARRAY(extendedInputTypes)) : (DE_LENGTH_OF_ARRAY(reducedInputTypes));
		const MatrixOp			op				= ops[opNdx].op;
		tcu::TestCaseGroup*		opGroup			= new tcu::TestCaseGroup(m_testCtx, ops[opNdx].name, ops[opNdx].desc);

		addChild(opGroup);

		for (int inTypeNdx = 0; inTypeNdx < inTypeListSize; inTypeNdx++)
		{
			const InputType		inputType	= inTypeList[inTypeNdx].type;

			for (int matTypeNdx = 0; matTypeNdx < DE_LENGTH_OF_ARRAY(matrixTypes); matTypeNdx++)
			{
				DataType	matType		= matrixTypes[matTypeNdx];
				const char*	matTypeName	= getDataTypeName(matType);

				for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
				{
					Precision	precision	= precisions[precNdx];
					const char*	precName	= getPrecisionName(precision);
					string		baseName	= string(inTypeList[inTypeNdx].name) + "_" + precName + "_" + matTypeName + "_";
					ShaderInput	matIn		(inputType, matType, precision);

					if (isOperationMatrixScalar(op))
					{
						// Matrix-scalar \note For div cases we use uniform input.
						ShaderInput scalarIn(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, TYPE_FLOAT, precision);
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_vertex").c_str(),		"Matrix-scalar case", matIn, scalarIn, op, true));
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_fragment").c_str(),	"Matrix-scalar case", matIn, scalarIn, op, false));
					}

					if (isOperationMatrixVector(op))
					{
						// Matrix-vector.
						DataType	vecType	= getDataTypeFloatVec(getDataTypeMatrixNumColumns(matType));
						ShaderInput vecIn	(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, vecType, precision);

						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + getDataTypeName(vecType) + "_vertex").c_str(),	"Matrix-vector case", matIn, vecIn, op, true));
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + getDataTypeName(vecType) + "_fragment").c_str(),	"Matrix-vector case", matIn, vecIn, op, false));

						// Vector-matrix.
						string vecMatName = string(inTypeList[inTypeNdx].name) + "_" + precName + "_" + getDataTypeName(vecType) + "_" + matTypeName;
						opGroup->addChild(new ShaderMatrixCase(m_context, (vecMatName + "_vertex").c_str(),		"Vector-matrix case", vecIn, matIn, op, true));
						opGroup->addChild(new ShaderMatrixCase(m_context, (vecMatName + "_fragment").c_str(),	"Vector-matrix case", vecIn, matIn, op, false));
					}

					if (isOperationMatrixMatrix(op))
					{
						// Matrix-matrix.
						ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, matType, precision);
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + matTypeName + "_vertex").c_str(),		"Matrix-matrix case", matIn, otherMatIn, op, true));
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + matTypeName + "_fragment").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, false));
					}

					if (isOperationUnary(op))
					{
						// op matrix
						ShaderInput voidInput(INPUTTYPE_LAST, TYPE_LAST, PRECISION_LAST);
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "vertex").c_str(),		"Matrix case", matIn, voidInput, op, true));
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "fragment").c_str(),	"Matrix case", matIn, voidInput, op, false));
					}

					if (isOperationAssignment(op))
					{
						ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, matType, precision);
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "vertex").c_str(),		"Matrix assignment case", matIn, otherMatIn, op, true));
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "fragment").c_str(),	"Matrix assignment case", matIn, otherMatIn, op, false));
					}
				}
			}
		}
	}
}